

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::AddOutPt(Clipper *this,TEdge *e,IntPoint *pt)

{
  value_type pOVar1;
  OutPt *pOVar2;
  bool bVar3;
  size_type sVar4;
  OutPt *pOVar5;
  reference ppOVar6;
  OutPt *pOVar7;
  OutPt *op2;
  OutPt *op2_1;
  OutPt *opBot;
  OutPt *op_1;
  OutRec *outRec_1;
  OutPt *op;
  OutRec *outRec;
  IntPoint *pIStack_20;
  bool ToFront;
  IntPoint *pt_local;
  TEdge *e_local;
  Clipper *this_local;
  
  outRec._7_1_ = e->side == esLeft;
  pIStack_20 = pt;
  pt_local = (IntPoint *)e;
  e_local = (TEdge *)this;
  if (e->outIdx < 0) {
    op = (OutPt *)CreateOutRec(this);
    std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::push_back
              (&this->m_PolyOuts,(value_type *)&op);
    sVar4 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                      (&this->m_PolyOuts);
    op->idx = (int)sVar4 + -1;
    *(int *)((long)&pt_local[5].X + 4) = op->idx;
    pOVar5 = (OutPt *)operator_new(0x28);
    OutPt::OutPt(pOVar5);
    op->next = pOVar5;
    op->prev = pOVar5;
    (pOVar5->pt).X = pIStack_20->X;
    (pOVar5->pt).Y = pIStack_20->Y;
    pOVar5->idx = op->idx;
    pOVar5->next = pOVar5;
    pOVar5->prev = pOVar5;
    SetHoleState(this,(TEdge *)pt_local,(OutRec *)op);
  }
  else {
    ppOVar6 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        (&this->m_PolyOuts,(long)e->outIdx);
    pOVar1 = *ppOVar6;
    pOVar5 = pOVar1->pts;
    if ((((outRec._7_1_ & 1) == 0) || (bVar3 = PointsEqual(pIStack_20,&pOVar5->pt), !bVar3)) &&
       (((outRec._7_1_ & 1) != 0 || (bVar3 = PointsEqual(pIStack_20,&pOVar5->prev->pt), !bVar3)))) {
      if ((*(EdgeSide *)((long)&pt_local[4].X + 4) | pOVar1->sides) != pOVar1->sides) {
        if ((pOVar1->sides == esNeither) && (pIStack_20->Y == (pOVar5->pt).Y)) {
          if ((outRec._7_1_ & 1) == 0) {
            if (pIStack_20->X == (pOVar5->pt).X + -1) {
              return;
            }
          }
          else if (pIStack_20->X == (pOVar5->pt).X + 1) {
            return;
          }
        }
        pOVar1->sides = pOVar1->sides | *(EdgeSide *)((long)&pt_local[4].X + 4);
        if (pOVar1->sides == esBoth) {
          if ((outRec._7_1_ & 1) == 0) {
            pOVar7 = pOVar1->pts->prev;
            pOVar2 = pOVar7->prev;
            if ((((pOVar7->pt).Y != (pOVar2->pt).Y) && ((pOVar7->pt).Y != pIStack_20->Y)) &&
               (((pOVar7->pt).X - (pOVar2->pt).X) / ((pOVar7->pt).Y - (pOVar2->pt).Y) <
                ((pOVar7->pt).X - pIStack_20->X) / ((pOVar7->pt).Y - pIStack_20->Y))) {
              pOVar1->bottomFlag = pOVar7;
            }
          }
          else {
            pOVar7 = pOVar1->pts;
            pOVar2 = pOVar7->next;
            if ((((pOVar7->pt).Y != (pOVar2->pt).Y) && ((pOVar7->pt).Y != pIStack_20->Y)) &&
               (((pOVar7->pt).X - pIStack_20->X) / ((pOVar7->pt).Y - pIStack_20->Y) <
                ((pOVar7->pt).X - (pOVar2->pt).X) / ((pOVar7->pt).Y - (pOVar2->pt).Y))) {
              pOVar1->bottomFlag = pOVar7;
            }
          }
        }
      }
      pOVar7 = (OutPt *)operator_new(0x28);
      OutPt::OutPt(pOVar7);
      (pOVar7->pt).X = pIStack_20->X;
      (pOVar7->pt).Y = pIStack_20->Y;
      pOVar7->idx = pOVar1->idx;
      if (((pOVar7->pt).Y == (pOVar1->bottomPt->pt).Y) &&
         ((pOVar7->pt).X < (pOVar1->bottomPt->pt).X)) {
        pOVar1->bottomPt = pOVar7;
      }
      pOVar7->next = pOVar5;
      pOVar7->prev = pOVar5->prev;
      pOVar7->prev->next = pOVar7;
      pOVar5->prev = pOVar7;
      if ((outRec._7_1_ & 1) != 0) {
        pOVar1->pts = pOVar7;
      }
    }
  }
  return;
}

Assistant:

void Clipper::AddOutPt(TEdge *e, const IntPoint &pt)
{
  bool ToFront = (e->side == esLeft);
  if(  e->outIdx < 0 )
  {
    OutRec *outRec = CreateOutRec();
    m_PolyOuts.push_back(outRec);
    outRec->idx = (int)m_PolyOuts.size()-1;
    e->outIdx = outRec->idx;
    OutPt* op = new OutPt;
    outRec->pts = op;
    outRec->bottomPt = op;
    op->pt = pt;
    op->idx = outRec->idx;
    op->next = op;
    op->prev = op;
    SetHoleState(e, outRec);
  } else
  {
    OutRec *outRec = m_PolyOuts[e->outIdx];
    OutPt* op = outRec->pts;
    if ((ToFront && PointsEqual(pt, op->pt)) ||
      (!ToFront && PointsEqual(pt, op->prev->pt))) return;

    if ((e->side | outRec->sides) != outRec->sides)
    {
      //check for 'rounding' artefacts ...
      if (outRec->sides == esNeither && pt.Y == op->pt.Y)
      {
        if (ToFront)
        {
          if (pt.X == op->pt.X +1) return;    //ie wrong side of bottomPt
        }
        else if (pt.X == op->pt.X -1) return; //ie wrong side of bottomPt
      }

      outRec->sides = (EdgeSide)(outRec->sides | e->side);
      if (outRec->sides == esBoth)
      {
        //A vertex from each side has now been added.
        //Vertices of one side of an output polygon are quite commonly close to
        //or even 'touching' edges of the other side of the output polygon.
        //Very occasionally vertices from one side can 'cross' an edge on the
        //the other side. The distance 'crossed' is always less that a unit
        //and is purely an artefact of coordinate rounding. Nevertheless, this
        //results in very tiny self-intersections. Because of the way
        //orientation is calculated, even tiny self-intersections can cause
        //the Orientation function to return the wrong result. Therefore, it's
        //important to ensure that any self-intersections close to BottomPt are
        //detected and removed before orientation is assigned.

        OutPt *opBot, *op2;
        if (ToFront)
        {
          opBot = outRec->pts;
          op2 = opBot->next; //op2 == right side
          if (opBot->pt.Y != op2->pt.Y && opBot->pt.Y != pt.Y &&
            ((opBot->pt.X - pt.X)/(opBot->pt.Y - pt.Y) <
            (opBot->pt.X - op2->pt.X)/(opBot->pt.Y - op2->pt.Y)))
               outRec->bottomFlag = opBot;
        } else
        {
          opBot = outRec->pts->prev;
          op2 = opBot->prev; //op2 == left side
          if (opBot->pt.Y != op2->pt.Y && opBot->pt.Y != pt.Y &&
            ((opBot->pt.X - pt.X)/(opBot->pt.Y - pt.Y) >
            (opBot->pt.X - op2->pt.X)/(opBot->pt.Y - op2->pt.Y)))
               outRec->bottomFlag = opBot;
        }
      }
    }

    OutPt* op2 = new OutPt;
    op2->pt = pt;
    op2->idx = outRec->idx;
    if (op2->pt.Y == outRec->bottomPt->pt.Y &&
      op2->pt.X < outRec->bottomPt->pt.X)
        outRec->bottomPt = op2;
    op2->next = op;
    op2->prev = op->prev;
    op2->prev->next = op2;
    op->prev = op2;
    if (ToFront) outRec->pts = op2;
  }
}